

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

ostream * operator<<(ostream *os,vector<Cards,_std::allocator<Cards>_> *v)

{
  ulong uVar1;
  ulong uVar2;
  pointer pCVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pCVar3 = (v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pCVar3) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      operator<<(os,(Cards *)((long)&pCVar3->id + lVar4));
      if (uVar2 != ((long)(v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar2 = uVar2 + 1;
      pCVar3 = (v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = ((long)(v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3 >> 4) * 0x6db6db6db6db6db7;
      lVar4 = lVar4 + 0x70;
    } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]\n",2);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, vector<Cards> v)
{
    os << "[";
    for (int i = 0; i < v.size(); ++i) {
        os << v[i];
        if (i != v.size() - 1)
            os << ", ";
    }
    os << "]\n";
    return os;
}